

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5HashScanInit(Fts5Hash *p,char *pTerm,int nTerm)

{
  undefined8 *puVar1;
  Fts5HashEntry *pRight;
  int iVar2;
  undefined8 *__s;
  Fts5HashEntry *pLeft;
  Fts5HashEntry *pFVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  
  p->pScan = (Fts5HashEntry *)0x0;
  iVar2 = sqlite3_initialize();
  iVar4 = 7;
  if ((iVar2 == 0) && (__s = (undefined8 *)sqlite3Malloc(0x100), __s != (undefined8 *)0x0)) {
    memset(__s,0,0x100);
    iVar2 = p->nSlot;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        pFVar3 = p->aSlot[lVar5];
        if (pFVar3 != (Fts5HashEntry *)0x0) {
          do {
            if ((pTerm == (char *)0x0) ||
               ((nTerm <= pFVar3->nKey && (iVar2 = bcmp(pFVar3 + 1,pTerm,(long)nTerm), iVar2 == 0)))
               ) {
              pFVar3->pScanNext = (Fts5HashEntry *)0x0;
              pRight = (Fts5HashEntry *)*__s;
              puVar6 = __s;
              pLeft = pFVar3;
              while (pRight != (Fts5HashEntry *)0x0) {
                pLeft = fts5HashEntryMerge(pLeft,pRight);
                *puVar6 = 0;
                puVar1 = puVar6 + 1;
                puVar6 = puVar6 + 1;
                pRight = (Fts5HashEntry *)*puVar1;
              }
              *puVar6 = pLeft;
            }
            pFVar3 = pFVar3->pHashNext;
          } while (pFVar3 != (Fts5HashEntry *)0x0);
          iVar2 = p->nSlot;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
    lVar5 = 0;
    pFVar3 = (Fts5HashEntry *)0x0;
    do {
      pFVar3 = fts5HashEntryMerge(pFVar3,(Fts5HashEntry *)__s[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    sqlite3_free(__s);
    p->pScan = pFVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int sqlite3Fts5HashScanInit(
  Fts5Hash *p,                    /* Hash table to query */
  const char *pTerm, int nTerm    /* Query prefix */
){
  return fts5HashEntrySort(p, pTerm, nTerm, &p->pScan);
}